

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterEndCDATA(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk;
  void *pvVar2;
  int iVar3;
  
  iVar3 = -1;
  if (writer != (xmlTextWriterPtr)0x0) {
    lk = xmlListFront(writer->nodes);
    if (lk != (xmlLinkPtr)0x0) {
      pvVar2 = xmlLinkGetData(lk);
      if ((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 8) == 6)) {
        iVar1 = xmlOutputBufferWriteString(writer->out,"]]>");
        if (-1 < iVar1) {
          xmlListPopFront(writer->nodes);
          iVar3 = iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlTextWriterEndCDATA(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    lk = xmlListFront(writer->nodes);
    if (lk == 0)
        return -1;

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_CDATA:
            count = xmlOutputBufferWriteString(writer->out, "]]>");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}